

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_buffer_sizes.c
# Opt level: O1

int check_block_sizes(test_state *state)

{
  aec_stream *paVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  
  uVar4 = 8;
  do {
    paVar1 = state->strm;
    paVar1->block_size = uVar4;
    paVar1->rsi = (uint)(state->buf_len / (ulong)((long)(int)uVar4 * (long)state->bytes_per_sample))
    ;
    iVar3 = encode_decode_large(state);
    if (iVar3 != 0) {
      return iVar3;
    }
    bVar2 = uVar4 < 0x21;
    uVar4 = uVar4 * 2;
  } while (bVar2);
  return 0;
}

Assistant:

int check_block_sizes(struct test_state *state)
{
    int bs, status;

    for (bs = 8; bs <= 64; bs *= 2) {
        state->strm->block_size = bs;
        state->strm->rsi = (int)(state->buf_len
                                 / (bs * state->bytes_per_sample));

        status = encode_decode_large(state);
        if (status)
            return status;
    }
    return 0;
}